

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::updateDualSteepestEdgeWeights(HEkkPrimal *this)

{
  HVector *from;
  int row_out;
  HEkk *pHVar1;
  double dVar2;
  double new_pivotal_edge_weight;
  
  from = &this->row_ep;
  HVectorBase<double>::copy<double>(&this->col_steepest_edge,from);
  updateFtranDSE(this,&this->col_steepest_edge);
  pHVar1 = this->ekk_instance_;
  if (pHVar1->simplex_in_scaled_space_ == true) {
    dVar2 = HVectorBase<double>::norm2(from);
  }
  else {
    dVar2 = HSimplexNla::rowEp2NormInScaledSpace(&pHVar1->simplex_nla_,this->row_out,from);
  }
  row_out = this->row_out;
  (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[row_out] = dVar2;
  dVar2 = HSimplexNla::pivotInScaledSpace
                    (&this->ekk_instance_->simplex_nla_,&this->col_aq,this->variable_in,row_out);
  new_pivotal_edge_weight =
       (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[this->row_out] / (dVar2 * dVar2);
  HEkk::updateDualSteepestEdgeWeights
            (this->ekk_instance_,this->row_out,this->variable_in,&this->col_aq,
             new_pivotal_edge_weight,-2.0 / dVar2,
             (this->col_steepest_edge).array.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->row_out] = new_pivotal_edge_weight;
  return;
}

Assistant:

void HEkkPrimal::updateDualSteepestEdgeWeights() {
  col_steepest_edge.copy(&row_ep);
  updateFtranDSE(col_steepest_edge);
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  // Compute the weight from row_ep and over-write the updated weight
  if (ekk_instance_.simplex_in_scaled_space_) {
    edge_weight[row_out] = row_ep.norm2();
  } else {
    edge_weight[row_out] =
        ekk_instance_.simplex_nla_.rowEp2NormInScaledSpace(row_out, row_ep);
  }
  const double pivot_in_scaled_space =
      ekk_instance_.simplex_nla_.pivotInScaledSpace(&col_aq, variable_in,
                                                    row_out);
  if (ekk_instance_.simplex_in_scaled_space_)
    assert(pivot_in_scaled_space == alpha_col);
  const double new_pivotal_edge_weight =
      edge_weight[row_out] / (pivot_in_scaled_space * pivot_in_scaled_space);
  const double Kai = -2 / pivot_in_scaled_space;
  ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, &col_aq,
                                              new_pivotal_edge_weight, Kai,
                                              col_steepest_edge.array.data());
  edge_weight[row_out] = new_pivotal_edge_weight;
}